

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O3

void __thiscall
mxx::custom_op<unsigned_char,true>::custom_op<std::bit_and<unsigned_char>>
          (custom_op<unsigned_char,true> *this)

{
  datatype dt;
  datatype local_40;
  int local_24;
  
  *(undefined ***)this = &PTR__custom_op_00162f00;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  this[0x28] = (custom_op<unsigned_char,true>)0x0;
  this[0x28] = (custom_op<unsigned_char,true>)0x1;
  *(undefined **)(this + 0x38) = &ompi_mpi_op_band;
  local_40._vptr_datatype = (_func_int **)&PTR__datatype_00162ce0;
  local_40.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_char;
  local_40.builtin = true;
  *(undefined **)(this + 0x30) = &ompi_mpi_unsigned_char;
  datatype::~datatype(&local_40);
  if (((byte)this[0x28] & 1) == 0) {
    local_40._vptr_datatype = (_func_int **)custom_function<std::bit_and<unsigned_char>>;
    std::function<void(void*,void*,int*)>::operator=
              ((function<void(void*,void*,int*)> *)(this + 8),
               (_Bind<void_(*(std::bit_and<unsigned_char>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(std::bit_and<unsigned_char>,_void_*,_void_*,_int_*)>
                *)&local_40);
    local_40._vptr_datatype = (_func_int **)&PTR__datatype_00162ce0;
    local_40.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_char;
    local_40.builtin = true;
    MPI_Type_dup(&ompi_mpi_unsigned_char,this + 0x30);
    local_24 = 0x543;
    attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::set
              ((MPI_Datatype *)(this + 0x30),&local_24,
               (function<void_(void_*,_void_*,_int_*)> *)(this + 8));
    MPI_Op_create(custom_op<unsigned_char,_true>::mpi_user_function,1,this + 0x38);
    datatype::~datatype(&local_40);
  }
  return;
}

Assistant:

custom_op(Func func) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            using namespace std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                  std::forward<Func>(func), _1, _2, _3);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, IsCommutative, &m_op);
        }
    }